

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

Transform * __thiscall pbrt::TransformCache::Lookup(TransformCache *this,Transform *t)

{
  memory_resource *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  int iVar18;
  undefined7 extraout_var;
  Transform *pTVar19;
  undefined4 extraout_var_00;
  ulong uVar20;
  long lVar21;
  __hashtable *__h;
  ulong uVar22;
  long *plVar23;
  long in_FS_OFFSET;
  Transform *tptr;
  __node_gen_type __node_gen;
  Transform *local_40;
  unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
  *local_38;
  
  *(long *)(in_FS_OFFSET + -0x40) = *(long *)(in_FS_OFFSET + -0x40) + 1;
  if ((this->hashTable)._M_h._M_element_count != 0) {
    uVar20 = 0xa929e4d6f47a6540;
    lVar21 = 0;
    do {
      uVar22 = *(long *)((long)(t->m).m[0] + lVar21) * -0x395b586ca42e166b;
      lVar21 = lVar21 + 8;
      uVar20 = (uVar20 ^ (uVar22 >> 0x2f ^ uVar22) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
    } while (lVar21 != 0x40);
    uVar22 = (uVar20 >> 0x2f ^ uVar20) * -0x395b586ca42e166b;
    uVar20 = (this->hashTable)._M_h._M_bucket_count;
    plVar23 = (long *)0x0;
    uVar22 = (uVar22 >> 0x2f ^ uVar22) % uVar20;
    pTVar19 = (Transform *)(this->hashTable)._M_h._M_buckets[uVar22];
    if (pTVar19 != (Transform *)0x0) {
      plVar23 = *(long **)(pTVar19->m).m[0];
    }
    while (plVar23 != (long *)0x0) {
      bVar17 = Transform::operator==((Transform *)plVar23[1],t);
      pTVar19 = (Transform *)CONCAT71(extraout_var,bVar17);
      if (bVar17) {
        *(long *)(in_FS_OFFSET + -0x38) = *(long *)(in_FS_OFFSET + -0x38) + 1;
        pTVar19 = (Transform *)plVar23[1];
        break;
      }
      plVar23 = (long *)*plVar23;
      if ((plVar23 != (long *)0x0) &&
         (pTVar19 = (Transform *)((ulong)plVar23[2] / uVar20), (ulong)plVar23[2] % uVar20 != uVar22)
         ) {
        plVar23 = (long *)0x0;
      }
    }
    if (plVar23 != (long *)0x0) {
      return pTVar19;
    }
  }
  pmVar1 = (this->alloc).memoryResource;
  iVar18 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,0x80,4);
  local_40 = (Transform *)CONCAT44(extraout_var_00,iVar18);
  uVar2 = *(undefined8 *)(t->m).m[0];
  uVar3 = *(undefined8 *)((t->m).m[0] + 2);
  uVar4 = *(undefined8 *)(t->m).m[1];
  uVar5 = *(undefined8 *)((t->m).m[1] + 2);
  uVar6 = *(undefined8 *)(t->m).m[2];
  uVar7 = *(undefined8 *)((t->m).m[2] + 2);
  uVar8 = *(undefined8 *)(t->m).m[3];
  uVar9 = *(undefined8 *)((t->m).m[3] + 2);
  uVar10 = *(undefined8 *)((t->mInv).m[0] + 2);
  uVar11 = *(undefined8 *)(t->mInv).m[1];
  uVar12 = *(undefined8 *)((t->mInv).m[1] + 2);
  uVar13 = *(undefined8 *)(t->mInv).m[2];
  uVar14 = *(undefined8 *)((t->mInv).m[2] + 2);
  uVar15 = *(undefined8 *)(t->mInv).m[3];
  uVar16 = *(undefined8 *)((t->mInv).m[3] + 2);
  *(undefined8 *)(local_40->mInv).m[0] = *(undefined8 *)(t->mInv).m[0];
  *(undefined8 *)((local_40->mInv).m[0] + 2) = uVar10;
  *(undefined8 *)(local_40->mInv).m[1] = uVar11;
  *(undefined8 *)((local_40->mInv).m[1] + 2) = uVar12;
  *(undefined8 *)(local_40->mInv).m[2] = uVar13;
  *(undefined8 *)((local_40->mInv).m[2] + 2) = uVar14;
  *(undefined8 *)(local_40->mInv).m[3] = uVar15;
  *(undefined8 *)((local_40->mInv).m[3] + 2) = uVar16;
  *(undefined8 *)(local_40->m).m[0] = uVar2;
  *(undefined8 *)((local_40->m).m[0] + 2) = uVar3;
  *(undefined8 *)(local_40->m).m[1] = uVar4;
  *(undefined8 *)((local_40->m).m[1] + 2) = uVar5;
  *(undefined8 *)(local_40->m).m[2] = uVar6;
  *(undefined8 *)((local_40->m).m[2] + 2) = uVar7;
  *(undefined8 *)(local_40->m).m[3] = uVar8;
  *(undefined8 *)((local_40->m).m[3] + 2) = uVar9;
  *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + 0x80;
  local_38 = &this->hashTable;
  std::
  _Hashtable<pbrt::Transform*,pbrt::Transform*,std::allocator<pbrt::Transform*>,std::__detail::_Identity,std::equal_to<pbrt::Transform*>,pbrt::TransformHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<pbrt::Transform*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<pbrt::Transform*,true>>>>
            ((_Hashtable<pbrt::Transform*,pbrt::Transform*,std::allocator<pbrt::Transform*>,std::__detail::_Identity,std::equal_to<pbrt::Transform*>,pbrt::TransformHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->hashTable,&local_40);
  return local_40;
}

Assistant:

const Transform *TransformCache::Lookup(const Transform &t) {
    ++nTransformCacheLookups;

    if (!hashTable.empty()) {
        size_t offset = t.Hash() % hashTable.bucket_count();
        for (auto iter = hashTable.begin(offset); iter != hashTable.end(offset); ++iter) {
            if (**iter == t) {
                ++nTransformCacheHits;
                return *iter;
            }
        }
    }
    Transform *tptr = alloc.new_object<Transform>(t);
    transformCacheBytes += sizeof(Transform);
    hashTable.insert(tptr);
    return tptr;
}